

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroAbs
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  long lVar1;
  initializer_list<AssemblyTemplateArgument> variables;
  string sraop;
  string subop;
  string macroText;
  char *local_c8;
  string local_c0 [32];
  char *local_a0;
  string local_98 [32];
  char *local_78;
  string local_70 [32];
  char *local_50;
  string local_48 [32];
  
  sraop._M_dataplus._M_p = (pointer)&sraop.field_2;
  sraop._M_string_length = 0;
  sraop.field_2._M_local_buf[0] = '\0';
  subop._M_dataplus._M_p = (pointer)&subop.field_2;
  subop._M_string_length = 0;
  subop.field_2._M_local_buf[0] = '\0';
  if ((in_R8D & 0xf) == 7) {
    std::__cxx11::string::assign((char *)&sraop);
  }
  else {
    if ((in_R8D & 0xf) != 5) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_00170266;
    }
    std::__cxx11::string::assign((char *)&sraop);
  }
  std::__cxx11::string::assign((char *)&subop);
  preprocessMacro_abi_cxx11_
            (&macroText,
             "\n\t\t%sraop% \tr1,%rs%,31\n\t\txor \t\t%rd%,%rs%,r1\n\t\t%subop% \t%rd%,%rd%,r1\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_c8 = "%rd%";
  std::__cxx11::string::string(local_c0,(string *)&immediates[1].primary.expression.constExpression)
  ;
  local_a0 = "%rs%";
  std::__cxx11::string::string(local_98,(string *)&(immediates->primary).expression);
  local_78 = "%sraop%";
  std::__cxx11::string::string(local_70,(string *)&sraop);
  local_50 = "%subop%";
  std::__cxx11::string::string(local_48,(string *)&subop);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_c8;
  createMacro(parser,(string *)registers,(int)&macroText,variables);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string(local_c0 + lVar1 + -8);
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
LAB_00170266:
  std::__cxx11::string::~string((string *)&subop);
  std::__cxx11::string::~string((string *)&sraop);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroAbs(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateAbs = R"(
		%sraop% 	r1,%rs%,31
		xor 		%rd%,%rs%,r1
		%subop% 	%rd%,%rd%,r1
	)";

	std::string sraop, subop;

	switch (flags & MIPSM_ACCESSMASK)
	{
	case MIPSM_W:	sraop = "sra"; subop = "subu"; break;
	case MIPSM_DW:	sraop = "dsra32"; subop = "dsubu"; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateAbs,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%sraop%",	sraop },
			{ "%subop%",	subop },
	});
}